

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

Vec_Str_t *
Super_PrecomputeStr(Mio_Library_t *pLibGen,int nVarsMax,int nLevels,int nGatesMax,float tDelayMax,
                   float tAreaMax,int TimeLimit,int fSkipInv,int fVerbose)

{
  uint *puVar1;
  float *pfVar2;
  Super_Gate_t *pSVar3;
  Mio_Gate_t *pMVar4;
  Super_Gate_t_conflict *pSVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  Mio_Gate_t **__ptr;
  Super_Man_t *pMan;
  Extra_MmFixed_t *pEVar11;
  stmm_table *psVar12;
  char *pcVar13;
  Super_Gate_t_conflict **ppSVar14;
  Super_Gate_t_conflict *pSVar15;
  ulong uVar16;
  stmm_generator *psVar17;
  ProgressBar *pPro;
  long *plVar18;
  Super_Gate_t *pSVar19;
  char *pcVar20;
  FILE *__s;
  char *pcVar21;
  Vec_Str_t *pVVar22;
  Super_Gate_t *pSVar23;
  Super_Gate_t *pSVar24;
  uint uVar25;
  long lVar26;
  abctime aVar27;
  long lVar28;
  Super_Gate_t *pSVar29;
  Super_Gate_t *pSVar30;
  Super_Gate_t *pSVar31;
  Super_Gate_t *pSVar32;
  Super_Man_t *pSVar33;
  Super_Gate_t *pSVar34;
  Super_Gate_t *pSVar35;
  ulong uVar36;
  uint uVar37;
  bool bVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float local_1b8;
  float tPinDelayMax;
  Super_Gate_t *local_180;
  long *local_178;
  Super_Gate_t *local_170;
  Super_Gate_t *local_168;
  uint uTruth [2];
  ulong local_138;
  timespec ts;
  ABC_PTRUINT_T Key;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  Super_Gate_t *local_b8;
  Super_Gate_t *local_b0;
  uint local_a8;
  int nGates;
  Super_Gate_t *local_a0;
  Super_Gate_t *local_98;
  int local_8c;
  long local_88;
  float local_7c;
  float tPinDelaysRes [6];
  long local_58;
  
  local_a8 = nLevels;
  local_8c = fSkipInv;
  if (6 < nVarsMax) {
    __assert_fail("nVarsMax < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                  ,0xb4,
                  "Vec_Str_t *Super_PrecomputeStr(Mio_Library_t *, int, int, int, float, float, int, int, int)"
                 );
  }
  if (nGatesMax < nVarsMax && nGatesMax != 0) {
    Super_PrecomputeStr_cold_1();
  }
  else {
    __ptr = Mio_CollectRoots(pLibGen,nVarsMax,tDelayMax,0,&nGates,fVerbose);
    if ((nGatesMax != 0) && (nGatesMax <= nGates)) {
      fwrite("Warning! Genlib library contains more gates than can be computed.\n",0x42,1,_stdout);
      fwrite("Only one-gate supergates are included in the supergate library.\n",0x40,1,_stdout);
    }
    pMan = (Super_Man_t *)calloc(1,0xe8);
    pEVar11 = Extra_MmFixedStart(0x70);
    pMan->pMem = pEVar11;
    psVar12 = stmm_init_table(st__ptrcmp,st__ptrhash);
    pMan->tTable = psVar12;
    pcVar13 = Mio_LibraryReadName(pLibGen);
    pMan->pName = pcVar13;
    pMan->nGatesMax = nGatesMax;
    pMan->fSkipInv = local_8c;
    pMan->tDelayMax = tDelayMax;
    pMan->tAreaMax = tAreaMax;
    pMan->TimeLimit = TimeLimit;
    if (TimeLimit == 0) {
      aVar27 = 0;
    }
    else {
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      aVar27 = lVar26 + (long)TimeLimit * 1000000;
    }
    pMan->TimeStop = aVar27;
    pMan->fVerbose = fVerbose;
    if (nGates != 0) {
      pMan->nVarsMax = nVarsMax;
      pMan->nMints = 1 << ((byte)nVarsMax & 0x1f);
      pMan->nLevels = 0;
      pMan->nGates = nVarsMax;
      ppSVar14 = (Super_Gate_t_conflict **)malloc((long)nVarsMax * 8 + 0x10);
      pMan->pGates = ppSVar14;
      if (0 < nVarsMax) {
        uVar36 = 0;
        do {
          pSVar15 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
          pSVar15->pRoot = (Mio_Gate_t *)0x0;
          *(undefined8 *)&pSVar15->field_0x8 = 0;
          *(undefined8 *)(pSVar15->uTruth + 1) = 0;
          pSVar15->pFanins[0] = (Super_Gate_t *)0x0;
          pSVar15->pFanins[1] = (Super_Gate_t *)0x0;
          pSVar15->pFanins[2] = (Super_Gate_t *)0x0;
          pSVar15->pFanins[3] = (Super_Gate_t *)0x0;
          pSVar15->pFanins[4] = (Super_Gate_t *)0x0;
          pSVar15->pFanins[5] = (Super_Gate_t *)0x0;
          pSVar15->Area = 0.0;
          pSVar15->ptDelays[0] = 0.0;
          pSVar15->ptDelays[1] = 0.0;
          pSVar15->ptDelays[2] = 0.0;
          pSVar15->ptDelays[3] = 0.0;
          pSVar15->ptDelays[4] = 0.0;
          *(undefined8 *)(pSVar15->ptDelays + 5) = 0;
          pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
          *(uint *)&pSVar15->field_0x8 = (int)uVar36 << 8 | (uint)(byte)pSVar15->field_0x8 | 1;
          uVar16 = 0;
          do {
            pSVar15->ptDelays[uVar16] = -9999.0;
            uVar16 = uVar16 + 1;
          } while ((uint)nVarsMax != uVar16);
          pSVar15->ptDelays[uVar36] = 0.0;
          pMan->pGates[uVar36] = pSVar15;
          Super_AddGateToTable(pMan,pSVar15);
          pMan->pInputs[uVar36] = pSVar15;
          uVar36 = uVar36 + 1;
        } while (uVar36 != (uint)nVarsMax);
      }
      uVar36 = 5;
      if (nVarsMax < 5) {
        uVar36 = (ulong)(uint)nVarsMax;
      }
      uVar25 = 0;
      do {
        if (0 < nVarsMax) {
          uVar16 = 0;
          do {
            if ((uVar25 >> ((uint)uVar16 & 0x1f) & 1) != 0) {
              puVar1 = pMan->pGates[uVar16]->uTruth;
              *puVar1 = *puVar1 | 1 << ((byte)uVar25 & 0x1f);
            }
            uVar16 = uVar16 + 1;
          } while (uVar36 != uVar16);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 >> ((byte)uVar36 & 0x1f) == 0);
      if (nVarsMax == 6) {
        ppSVar14 = pMan->pGates;
        lVar26 = 0;
        do {
          pSVar15 = ppSVar14[lVar26];
          pSVar15->uTruth[1] = pSVar15->uTruth[0];
          lVar26 = lVar26 + 1;
        } while (lVar26 != 5);
        pSVar15 = ppSVar14[5];
        pSVar15->uTruth[0] = 0;
        pSVar15->uTruth[1] = 0xffffffff;
      }
      else if (0 < nVarsMax) {
        ppSVar14 = pMan->pGates;
        uVar36 = 0;
        do {
          ppSVar14[uVar36]->uTruth[1] = 0;
          uVar36 = uVar36 + 1;
        } while ((uint)nVarsMax != uVar36);
      }
      iVar9 = clock_gettime(3,(timespec *)&ts);
      uVar25 = local_a8;
      if (iVar9 < 0) {
        local_88 = 1;
      }
      else {
        lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        local_88 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      if (fVerbose != 0) {
        printf("Computing supergates with %d inputs, %d levels, and %d max gates.\n",
               (ulong)(uint)pMan->nVarsMax,(ulong)local_a8,(ulong)(uint)nGatesMax);
        printf("Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
               SUB84((double)pMan->tDelayMax,0),(ulong)(uint)pMan->TimeLimit);
      }
      if (0 < (int)uVar25) {
        uVar36 = 1;
        do {
          if (pMan->TimeStop != 0) {
            iVar9 = clock_gettime(3,(timespec *)&ts);
            if (iVar9 < 0) {
              lVar26 = -1;
            }
            else {
              lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            if (pMan->TimeStop < lVar26) break;
          }
          iVar10 = clock_gettime(3,(timespec *)&ts);
          iVar9 = nGates;
          if (iVar10 < 0) {
            local_58 = 1;
          }
          else {
            lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            local_58 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          uVar16 = (ulong)(uint)nGates;
          if (pMan->pGates != (Super_Gate_t_conflict **)0x0) {
            free(pMan->pGates);
            pMan->pGates = (Super_Gate_t_conflict **)0x0;
          }
          ppSVar14 = (Super_Gate_t_conflict **)malloc((long)pMan->nAdded << 3);
          pMan->pGates = ppSVar14;
          pMan->nGates = 0;
          psVar17 = stmm_init_gen(pMan->tTable);
          while (iVar10 = stmm_gen(psVar17,(char **)&Key,(char **)&ts), iVar10 != 0) {
            if (ts.tv_sec != 0) {
              lVar26 = (long)pMan->nGates;
              pSVar15 = (Super_Gate_t_conflict *)ts.tv_sec;
              do {
                pMan->pGates[lVar26] = pSVar15;
                lVar26 = lVar26 + 1;
                pSVar15 = pSVar15->pNext;
              } while (pSVar15 != (Super_Gate_t_conflict *)0x0);
              pMan->nGates = (int)lVar26;
            }
          }
          stmm_free_gen(psVar17);
          if (10000 < pMan->nGates) {
            printf("Sorting array of %d supergates...\r");
            fflush(_stdout);
          }
          qsort(pMan->pGates,(long)pMan->nGates,8,Super_DelayCompare);
          fVar39 = (*pMan->pGates)->tDelayMax;
          pfVar2 = &pMan->pGates[(long)pMan->nGates + -1]->tDelayMax;
          if (*pfVar2 <= fVar39 && fVar39 != *pfVar2) {
            __assert_fail("Super_DelayCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                          ,0x175,
                          "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)")
            ;
          }
          if (10000 < pMan->nGates) {
            printf("                                       \r");
          }
          pPro = Extra_ProgressBarStart((FILE *)_stdout,pMan->TimeLimit);
          iVar10 = clock_gettime(3,(timespec *)&ts);
          if (iVar10 < 0) {
            aVar27 = 999999;
          }
          else {
            aVar27 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000 + 1000000;
          }
          pMan->TimePrint = aVar27;
          plVar18 = (long *)malloc((long)pMan->nGates << 3);
          if (0 < iVar9) {
            local_1b8 = 0.0;
            local_138 = 0;
            local_178 = plVar18;
            do {
              if ((pMan->nLevels < 1) || (iVar9 = Mio_GateReadPinNum(__ptr[local_138]), iVar9 < 4))
              {
                dVar6 = Mio_GateReadDelayMax(__ptr[local_138]);
                iVar9 = pMan->nGates;
                if ((long)iVar9 < 1) {
                  pSVar30 = (Super_Gate_t *)0x0;
                }
                else {
                  iVar10 = pMan->nLevels;
                  lVar26 = 0;
                  pSVar30 = (Super_Gate_t *)0x0;
                  do {
                    if ((iVar10 < 1) || ((*(uint *)&pMan->pGates[lVar26]->field_0x8 & 0xfc) < 9)) {
                      pSVar15 = pMan->pGates[lVar26];
                      plVar18[(int)pSVar30] = (long)pSVar15;
                      pSVar30 = (Super_Gate_t *)(ulong)((int)pSVar30 + 1);
                      if ((pMan->tDelayMax < pSVar15->tDelayMax + (float)dVar6) &&
                         (0.0 < pMan->tDelayMax)) break;
                    }
                    lVar26 = lVar26 + 1;
                  } while (iVar9 != lVar26);
                }
                iVar9 = (int)pSVar30;
                if (pMan->fVerbose != 0) {
                  uVar25 = Mio_GateReadPinNum(__ptr[local_138]);
                  printf("Trying %d choices for %d inputs\r",pSVar30,(ulong)uVar25);
                }
                if (10000 < iVar9) {
                  printf("Sorting array of %d supergates...\r",pSVar30);
                }
                plVar18 = local_178;
                qsort(local_178,(long)iVar9,8,Super_AreaCompare);
                fVar39 = *(float *)(*plVar18 + 0x48);
                pfVar2 = (float *)(plVar18[(long)iVar9 - 1] + 0x48);
                if (*pfVar2 <= fVar39 && fVar39 != *pfVar2) {
                  __assert_fail("Super_AreaCompare( ppGatesLimit, ppGatesLimit + nGatesLimit - 1 ) <= 0"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                                ,0x1ad,
                                "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                               );
                }
                if (10000 < iVar9) {
                  printf("                                       \r");
                }
                dVar6 = Mio_GateReadArea(__ptr[local_138]);
                uVar25 = Mio_GateReadPinNum(__ptr[local_138]);
                if (6 < uVar25) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                                ,0x2cc,
                                "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                               );
                }
                fVar39 = (float)dVar6;
                plVar18 = local_178;
                switch(uVar25) {
                case 0:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                                ,0x1b7,
                                "Super_Man_t *Super_Compute(Super_Man_t *, Mio_Gate_t **, int, int, int)"
                               );
                case 1:
                  if (iVar9 < 1) {
LAB_00414730:
                    iVar9 = 0;
                  }
                  else {
                    pSVar23 = (Super_Gate_t *)0x0;
                    iVar9 = 0;
                    do {
                      pSVar34 = (Super_Gate_t *)plVar18[(long)pSVar23];
                      if ((pSVar34 == (Super_Gate_t *)0x0) || (iVar9 != 0)) break;
                      iVar9 = Super_CheckTimeout(pPro,pMan);
                      if ((local_8c == 0) ||
                         ((pSVar34->tDelayMax != 0.0 || (NAN(pSVar34->tDelayMax))))) {
                        local_1b8 = pSVar34->Area + fVar39;
                        if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b8)) break;
                        Key._0_4_ = pSVar34->uTruth[0];
                        Key._4_4_ = pSVar34->uTruth[1];
                        ts.tv_sec = (__time_t)pSVar34->ptDelays;
                        Mio_DeriveGateDelays
                                  (__ptr[local_138],(float **)&ts,1,pMan->nVarsMax,-9999.0,
                                   tPinDelaysRes,&tPinDelayMax);
                        Mio_DeriveTruthTable
                                  (__ptr[local_138],(uint (*) [2])&Key,1,pMan->nVarsMax,uTruth);
                        iVar10 = Super_CompareGates(pMan,uTruth,local_1b8,tPinDelaysRes,
                                                    pMan->nVarsMax);
                        fVar40 = tPinDelayMax;
                        plVar18 = local_178;
                        if (iVar10 != 0) {
                          pMVar4 = __ptr[local_138];
                          iVar10 = pMan->nVarsMax;
                          pSVar15 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
                          pSVar15->pRoot = (Mio_Gate_t *)0x0;
                          *(undefined8 *)&pSVar15->field_0x8 = 0;
                          *(undefined8 *)(pSVar15->uTruth + 1) = 0;
                          pSVar15->pFanins[0] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[1] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[2] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[3] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[4] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[5] = (Super_Gate_t *)0x0;
                          pSVar15->Area = 0.0;
                          pSVar15->ptDelays[0] = 0.0;
                          pSVar15->ptDelays[1] = 0.0;
                          pSVar15->ptDelays[2] = 0.0;
                          pSVar15->ptDelays[3] = 0.0;
                          pSVar15->ptDelays[4] = 0.0;
                          *(undefined8 *)(pSVar15->ptDelays + 5) = 0;
                          pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                          pSVar15->pRoot = pMVar4;
                          pSVar15->uTruth[0] = uTruth[0];
                          pSVar15->uTruth[1] = uTruth[1];
                          memcpy(pSVar15->ptDelays,tPinDelaysRes,(long)iVar10 << 2);
                          pSVar15->Area = local_1b8;
                          *(uint *)&pSVar15->field_0x8 =
                               *(uint *)&pSVar15->field_0x8 & 0xffffff03 | 4;
                          pSVar15->pFanins[0] = pSVar34;
                          pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                          pSVar15->tDelayMax = fVar40;
                          Super_AddGateToTable(pMan,pSVar15);
                          plVar18 = local_178;
                          if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses)) goto LAB_00414757;
                        }
                      }
                      pSVar23 = (Super_Gate_t *)((long)&pSVar23->pRoot + 1);
                    } while (pSVar30 != pSVar23);
                  }
                  break;
                case 2:
                  if (iVar9 < 1) goto LAB_00414730;
                  pSVar23 = (Super_Gate_t *)0x0;
                  iVar9 = 0;
                  do {
                    pSVar34 = (Super_Gate_t *)plVar18[(long)pSVar23];
                    if (pSVar34 == (Super_Gate_t *)0x0) break;
                    fVar40 = pSVar34->Area + fVar39;
                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar40)) break;
                    Key._0_4_ = pSVar34->uTruth[0];
                    Key._4_4_ = pSVar34->uTruth[1];
                    ts.tv_sec = (__time_t)pSVar34->ptDelays;
                    pSVar29 = (Super_Gate_t *)0x0;
                    local_168 = (Super_Gate_t *)CONCAT44(local_168._4_4_,fVar40);
                    do {
                      pSVar35 = (Super_Gate_t *)plVar18[(long)pSVar29];
                      if (pSVar35 == (Super_Gate_t *)0x0) break;
                      if (pSVar23 != pSVar29) {
                        if (iVar9 != 0) goto LAB_00414757;
                        iVar9 = Super_CheckTimeout(pPro,pMan);
                        local_1b8 = pSVar35->Area + local_168._0_4_;
                        if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b8)) break;
                        local_e0 = pSVar35->uTruth[0];
                        local_dc = pSVar35->uTruth[1];
                        ts.tv_nsec = (__syscall_slong_t)pSVar35->ptDelays;
                        Mio_DeriveGateDelays
                                  (__ptr[local_138],(float **)&ts,2,pMan->nVarsMax,-9999.0,
                                   tPinDelaysRes,&tPinDelayMax);
                        Mio_DeriveTruthTable
                                  (__ptr[local_138],(uint (*) [2])&Key,2,pMan->nVarsMax,uTruth);
                        iVar10 = Super_CompareGates(pMan,uTruth,local_1b8,tPinDelaysRes,
                                                    pMan->nVarsMax);
                        fVar40 = tPinDelayMax;
                        plVar18 = local_178;
                        if (iVar10 != 0) {
                          pMVar4 = __ptr[local_138];
                          iVar10 = pMan->nVarsMax;
                          pSVar15 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
                          pSVar15->pRoot = (Mio_Gate_t *)0x0;
                          *(undefined8 *)&pSVar15->field_0x8 = 0;
                          *(undefined8 *)(pSVar15->uTruth + 1) = 0;
                          pSVar15->pFanins[0] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[1] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[2] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[3] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[4] = (Super_Gate_t *)0x0;
                          pSVar15->pFanins[5] = (Super_Gate_t *)0x0;
                          pSVar15->Area = 0.0;
                          pSVar15->ptDelays[0] = 0.0;
                          pSVar15->ptDelays[1] = 0.0;
                          pSVar15->ptDelays[2] = 0.0;
                          pSVar15->ptDelays[3] = 0.0;
                          pSVar15->ptDelays[4] = 0.0;
                          *(undefined8 *)(pSVar15->ptDelays + 5) = 0;
                          pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                          pSVar15->pRoot = pMVar4;
                          pSVar15->uTruth[0] = uTruth[0];
                          pSVar15->uTruth[1] = uTruth[1];
                          memcpy(pSVar15->ptDelays,tPinDelaysRes,(long)iVar10 << 2);
                          pSVar15->Area = local_1b8;
                          *(uint *)&pSVar15->field_0x8 =
                               *(uint *)&pSVar15->field_0x8 & 0xffffff03 | 8;
                          pSVar15->pFanins[0] = pSVar34;
                          pSVar15->pFanins[1] = pSVar35;
                          pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                          pSVar15->tDelayMax = fVar40;
                          Super_AddGateToTable(pMan,pSVar15);
                          plVar18 = local_178;
                          if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses)) goto LAB_00414757;
                        }
                      }
                      pSVar29 = (Super_Gate_t *)((long)&pSVar29->pRoot + 1);
                    } while (pSVar30 != pSVar29);
                    pSVar23 = (Super_Gate_t *)((long)&pSVar23->pRoot + 1);
                  } while (pSVar23 != pSVar30);
                  break;
                case 3:
                  if (iVar9 < 1) goto LAB_00414730;
                  pSVar23 = (Super_Gate_t *)0x0;
                  iVar9 = 0;
                  local_180 = pSVar30;
                  do {
                    pSVar34 = (Super_Gate_t *)plVar18[(long)pSVar23];
                    if (pSVar34 == (Super_Gate_t *)0x0) break;
                    fVar40 = pSVar34->Area + fVar39;
                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar40)) break;
                    Key._0_4_ = pSVar34->uTruth[0];
                    Key._4_4_ = pSVar34->uTruth[1];
                    ts.tv_sec = (__time_t)pSVar34->ptDelays;
                    pSVar29 = (Super_Gate_t *)0x0;
                    do {
                      pSVar35 = (Super_Gate_t *)plVar18[(long)pSVar29];
                      if (pSVar35 == (Super_Gate_t *)0x0) break;
                      if (pSVar29 != pSVar23) {
                        fVar41 = pSVar35->Area + fVar40;
                        if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar41)) break;
                        local_168 = (Super_Gate_t *)CONCAT44(local_168._4_4_,fVar41);
                        local_e0 = pSVar35->uTruth[0];
                        local_dc = pSVar35->uTruth[1];
                        ts.tv_nsec = (__syscall_slong_t)pSVar35->ptDelays;
                        pSVar24 = (Super_Gate_t *)0x0;
                        local_170 = pSVar35;
                        do {
                          pSVar35 = (Super_Gate_t *)plVar18[(long)pSVar24];
                          if (pSVar35 == (Super_Gate_t *)0x0) break;
                          if (pSVar29 != pSVar24 && pSVar23 != pSVar24) {
                            if (iVar9 != 0) goto LAB_00414757;
                            iVar9 = Super_CheckTimeout(pPro,pMan);
                            local_1b8 = pSVar35->Area + local_168._0_4_;
                            if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b8)) break;
                            local_d8 = pSVar35->uTruth[0];
                            local_d4 = pSVar35->uTruth[1];
                            Mio_DeriveGateDelays
                                      (__ptr[local_138],(float **)&ts,3,pMan->nVarsMax,-9999.0,
                                       tPinDelaysRes,&tPinDelayMax);
                            Mio_DeriveTruthTable
                                      (__ptr[local_138],(uint (*) [2])&Key,3,pMan->nVarsMax,uTruth);
                            iVar10 = Super_CompareGates(pMan,uTruth,local_1b8,tPinDelaysRes,
                                                        pMan->nVarsMax);
                            fVar41 = tPinDelayMax;
                            plVar18 = local_178;
                            pSVar30 = local_180;
                            if (iVar10 != 0) {
                              pMVar4 = __ptr[local_138];
                              iVar10 = pMan->nVarsMax;
                              pSVar15 = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem)
                              ;
                              pSVar15->pRoot = (Mio_Gate_t *)0x0;
                              *(undefined8 *)&pSVar15->field_0x8 = 0;
                              *(undefined8 *)(pSVar15->uTruth + 1) = 0;
                              pSVar15->pFanins[0] = (Super_Gate_t *)0x0;
                              pSVar15->pFanins[1] = (Super_Gate_t *)0x0;
                              pSVar15->pFanins[2] = (Super_Gate_t *)0x0;
                              pSVar15->pFanins[3] = (Super_Gate_t *)0x0;
                              pSVar15->pFanins[4] = (Super_Gate_t *)0x0;
                              pSVar15->pFanins[5] = (Super_Gate_t *)0x0;
                              pSVar15->Area = 0.0;
                              pSVar15->ptDelays[0] = 0.0;
                              pSVar15->ptDelays[1] = 0.0;
                              pSVar15->ptDelays[2] = 0.0;
                              pSVar15->ptDelays[3] = 0.0;
                              pSVar15->ptDelays[4] = 0.0;
                              *(undefined8 *)(pSVar15->ptDelays + 5) = 0;
                              pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                              pSVar15->pRoot = pMVar4;
                              pSVar15->uTruth[0] = uTruth[0];
                              pSVar15->uTruth[1] = uTruth[1];
                              memcpy(pSVar15->ptDelays,tPinDelaysRes,(long)iVar10 << 2);
                              pSVar15->Area = local_1b8;
                              *(uint *)&pSVar15->field_0x8 =
                                   *(uint *)&pSVar15->field_0x8 & 0xffffff03 | 0xc;
                              pSVar15->pFanins[0] = pSVar34;
                              pSVar15->pFanins[1] = local_170;
                              pSVar15->pFanins[2] = pSVar35;
                              pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                              pSVar15->tDelayMax = fVar41;
                              Super_AddGateToTable(pMan,pSVar15);
                              plVar18 = local_178;
                              pSVar30 = local_180;
                              if ((nGatesMax != 0) && (nGatesMax < pMan->nClasses))
                              goto LAB_00414757;
                            }
                          }
                          pSVar24 = (Super_Gate_t *)((long)&pSVar24->pRoot + 1);
                        } while (pSVar30 != pSVar24);
                      }
                      pSVar29 = (Super_Gate_t *)((long)&pSVar29->pRoot + 1);
                    } while (pSVar29 != pSVar30);
                    pSVar23 = (Super_Gate_t *)((long)&pSVar23->pRoot + 1);
                  } while (pSVar23 != pSVar30);
                  break;
                case 4:
                  if (iVar9 < 1) goto LAB_00414730;
                  pSVar23 = (Super_Gate_t *)0x0;
                  iVar9 = 0;
                  do {
                    pSVar34 = (Super_Gate_t *)plVar18[(long)pSVar23];
                    if (pSVar34 == (Super_Gate_t *)0x0) break;
                    fVar40 = pSVar34->Area + fVar39;
                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar40)) break;
                    Key._0_4_ = pSVar34->uTruth[0];
                    Key._4_4_ = pSVar34->uTruth[1];
                    ts.tv_sec = (__time_t)pSVar34->ptDelays;
                    pSVar29 = (Super_Gate_t *)0x0;
                    local_170 = (Super_Gate_t *)CONCAT44(local_170._4_4_,fVar40);
                    local_180 = pSVar23;
                    do {
                      pSVar35 = (Super_Gate_t *)plVar18[(long)pSVar29];
                      if (pSVar35 == (Super_Gate_t *)0x0) break;
                      if (pSVar29 != pSVar23) {
                        fVar41 = pSVar35->Area + fVar40;
                        if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar41)) break;
                        local_e0 = pSVar35->uTruth[0];
                        local_dc = pSVar35->uTruth[1];
                        ts.tv_nsec = (__syscall_slong_t)pSVar35->ptDelays;
                        pSVar24 = (Super_Gate_t *)0x0;
                        do {
                          pSVar19 = (Super_Gate_t *)plVar18[(long)pSVar24];
                          if (pSVar19 == (Super_Gate_t *)0x0) break;
                          if (pSVar24 != pSVar29 && pSVar24 != pSVar23) {
                            fVar42 = pSVar19->Area + fVar41;
                            if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar42)) break;
                            local_d8 = pSVar19->uTruth[0];
                            local_d4 = pSVar19->uTruth[1];
                            pSVar31 = (Super_Gate_t *)0x0;
                            local_168 = pSVar24;
                            local_b0 = pSVar19;
                            do {
                              pSVar19 = (Super_Gate_t *)plVar18[(long)pSVar31];
                              if (pSVar19 == (Super_Gate_t *)0x0) break;
                              if (((pSVar24 != pSVar31) && (pSVar23 != pSVar31)) &&
                                 (pSVar29 != pSVar31)) {
                                if (iVar9 != 0) goto LAB_00414757;
                                iVar9 = Super_CheckTimeout(pPro,pMan);
                                local_1b8 = pSVar19->Area + fVar42;
                                if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b8)) {
                                  pSVar23 = local_180;
                                  pSVar24 = local_168;
                                  fVar40 = local_170._0_4_;
                                  break;
                                }
                                local_d0 = pSVar19->uTruth[0];
                                local_cc = pSVar19->uTruth[1];
                                Mio_DeriveGateDelays
                                          (__ptr[local_138],(float **)&ts,4,pMan->nVarsMax,-9999.0,
                                           tPinDelaysRes,&tPinDelayMax);
                                Mio_DeriveTruthTable
                                          (__ptr[local_138],(uint (*) [2])&Key,4,pMan->nVarsMax,
                                           uTruth);
                                iVar10 = Super_CompareGates(pMan,uTruth,local_1b8,tPinDelaysRes,
                                                            pMan->nVarsMax);
                                fVar40 = tPinDelayMax;
                                if (iVar10 != 0) {
                                  pMVar4 = __ptr[local_138];
                                  iVar10 = pMan->nVarsMax;
                                  pSVar15 = (Super_Gate_t_conflict *)
                                            Extra_MmFixedEntryFetch(pMan->pMem);
                                  pSVar15->pRoot = (Mio_Gate_t *)0x0;
                                  *(undefined8 *)&pSVar15->field_0x8 = 0;
                                  *(undefined8 *)(pSVar15->uTruth + 1) = 0;
                                  pSVar15->pFanins[0] = (Super_Gate_t *)0x0;
                                  pSVar15->pFanins[1] = (Super_Gate_t *)0x0;
                                  pSVar15->pFanins[2] = (Super_Gate_t *)0x0;
                                  pSVar15->pFanins[3] = (Super_Gate_t *)0x0;
                                  pSVar15->pFanins[4] = (Super_Gate_t *)0x0;
                                  pSVar15->pFanins[5] = (Super_Gate_t *)0x0;
                                  pSVar15->Area = 0.0;
                                  pSVar15->ptDelays[0] = 0.0;
                                  pSVar15->ptDelays[1] = 0.0;
                                  pSVar15->ptDelays[2] = 0.0;
                                  pSVar15->ptDelays[3] = 0.0;
                                  pSVar15->ptDelays[4] = 0.0;
                                  *(undefined8 *)(pSVar15->ptDelays + 5) = 0;
                                  pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                                  pSVar15->pRoot = pMVar4;
                                  pSVar15->uTruth[0] = uTruth[0];
                                  pSVar15->uTruth[1] = uTruth[1];
                                  memcpy(pSVar15->ptDelays,tPinDelaysRes,(long)iVar10 << 2);
                                  pSVar15->Area = local_1b8;
                                  *(uint *)&pSVar15->field_0x8 =
                                       *(uint *)&pSVar15->field_0x8 & 0xffffff03 | 0x10;
                                  pSVar15->pFanins[0] = pSVar34;
                                  pSVar15->pFanins[1] = pSVar35;
                                  pSVar15->pFanins[2] = local_b0;
                                  pSVar15->pFanins[3] = pSVar19;
                                  pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                                  pSVar15->tDelayMax = fVar40;
                                  Super_AddGateToTable(pMan,pSVar15);
                                  if (nGatesMax != 0) {
                                    pSVar23 = local_180;
                                    pSVar24 = local_168;
                                    plVar18 = local_178;
                                    fVar40 = local_170._0_4_;
                                    if (pMan->nClasses <= nGatesMax) goto LAB_00413d3f;
                                    goto LAB_00414757;
                                  }
                                }
                                pSVar23 = local_180;
                                pSVar24 = local_168;
                                plVar18 = local_178;
                                fVar40 = local_170._0_4_;
                              }
LAB_00413d3f:
                              pSVar31 = (Super_Gate_t *)((long)&pSVar31->pRoot + 1);
                            } while (pSVar30 != pSVar31);
                          }
                          pSVar24 = (Super_Gate_t *)((long)&pSVar24->pRoot + 1);
                        } while (pSVar24 != pSVar30);
                      }
                      pSVar29 = (Super_Gate_t *)((long)&pSVar29->pRoot + 1);
                    } while (pSVar29 != pSVar30);
                    pSVar23 = (Super_Gate_t *)((long)&pSVar23->pRoot + 1);
                  } while (pSVar23 != pSVar30);
                  break;
                case 5:
                  if (iVar9 < 1) goto LAB_00414730;
                  pSVar23 = (Super_Gate_t *)0x0;
                  iVar9 = 0;
                  local_b0 = pSVar30;
                  do {
                    pSVar34 = (Super_Gate_t *)plVar18[(long)pSVar23];
                    if (pSVar34 == (Super_Gate_t *)0x0) break;
                    fVar40 = pSVar34->Area + fVar39;
                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar40)) break;
                    Key._0_4_ = pSVar34->uTruth[0];
                    Key._4_4_ = pSVar34->uTruth[1];
                    ts.tv_sec = (__time_t)pSVar34->ptDelays;
                    pSVar29 = (Super_Gate_t *)0x0;
                    local_a0 = pSVar34;
                    do {
                      local_b8 = (Super_Gate_t *)plVar18[(long)pSVar29];
                      if (local_b8 == (Super_Gate_t *)0x0) break;
                      if (pSVar29 != pSVar23) {
                        fVar41 = local_b8->Area + fVar40;
                        if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar41)) break;
                        local_e0 = local_b8->uTruth[0];
                        local_dc = local_b8->uTruth[1];
                        ts.tv_nsec = (__syscall_slong_t)local_b8->ptDelays;
                        pSVar34 = (Super_Gate_t *)0x0;
                        local_170 = (Super_Gate_t *)CONCAT44(local_170._4_4_,fVar41);
                        local_180 = pSVar29;
                        do {
                          pSVar35 = (Super_Gate_t *)plVar18[(long)pSVar34];
                          if (pSVar35 == (Super_Gate_t *)0x0) break;
                          if (pSVar34 != pSVar29 && pSVar34 != pSVar23) {
                            fVar42 = pSVar35->Area + fVar41;
                            if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar42)) break;
                            local_d8 = pSVar35->uTruth[0];
                            local_d4 = pSVar35->uTruth[1];
                            pSVar24 = (Super_Gate_t *)0x0;
                            do {
                              pSVar19 = (Super_Gate_t *)plVar18[(long)pSVar24];
                              if (pSVar19 == (Super_Gate_t *)0x0) break;
                              if (((pSVar24 != pSVar34) && (pSVar24 != pSVar23)) &&
                                 (pSVar24 != pSVar29)) {
                                fVar43 = pSVar19->Area + fVar42;
                                if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar43)) break;
                                local_168 = (Super_Gate_t *)CONCAT44(local_168._4_4_,fVar43);
                                local_d0 = pSVar19->uTruth[0];
                                local_cc = pSVar19->uTruth[1];
                                pSVar31 = (Super_Gate_t *)0x0;
                                local_98 = pSVar19;
                                do {
                                  pSVar19 = (Super_Gate_t *)plVar18[(long)pSVar31];
                                  if (pSVar19 == (Super_Gate_t *)0x0) break;
                                  if (((pSVar24 != pSVar31) && (pSVar34 != pSVar31)) &&
                                     ((pSVar23 != pSVar31 && (pSVar29 != pSVar31)))) {
                                    if (iVar9 != 0) goto LAB_00414757;
                                    iVar9 = Super_CheckTimeout(pPro,pMan);
                                    local_1b8 = pSVar19->Area + local_168._0_4_;
                                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b8)) {
                                      pSVar29 = local_180;
                                      fVar41 = local_170._0_4_;
                                      break;
                                    }
                                    local_c8 = pSVar19->uTruth[0];
                                    local_c4 = pSVar19->uTruth[1];
                                    Mio_DeriveGateDelays
                                              (__ptr[local_138],(float **)&ts,5,pMan->nVarsMax,
                                               -9999.0,tPinDelaysRes,&tPinDelayMax);
                                    Mio_DeriveTruthTable
                                              (__ptr[local_138],(uint (*) [2])&Key,5,pMan->nVarsMax,
                                               uTruth);
                                    iVar10 = Super_CompareGates(pMan,uTruth,local_1b8,tPinDelaysRes,
                                                                pMan->nVarsMax);
                                    fVar41 = tPinDelayMax;
                                    if (iVar10 != 0) {
                                      pMVar4 = __ptr[local_138];
                                      iVar10 = pMan->nVarsMax;
                                      pSVar15 = (Super_Gate_t_conflict *)
                                                Extra_MmFixedEntryFetch(pMan->pMem);
                                      pSVar15->pRoot = (Mio_Gate_t *)0x0;
                                      *(undefined8 *)&pSVar15->field_0x8 = 0;
                                      *(undefined8 *)(pSVar15->uTruth + 1) = 0;
                                      pSVar15->pFanins[0] = (Super_Gate_t *)0x0;
                                      pSVar15->pFanins[1] = (Super_Gate_t *)0x0;
                                      pSVar15->pFanins[2] = (Super_Gate_t *)0x0;
                                      pSVar15->pFanins[3] = (Super_Gate_t *)0x0;
                                      pSVar15->pFanins[4] = (Super_Gate_t *)0x0;
                                      pSVar15->pFanins[5] = (Super_Gate_t *)0x0;
                                      pSVar15->Area = 0.0;
                                      pSVar15->ptDelays[0] = 0.0;
                                      pSVar15->ptDelays[1] = 0.0;
                                      pSVar15->ptDelays[2] = 0.0;
                                      pSVar15->ptDelays[3] = 0.0;
                                      pSVar15->ptDelays[4] = 0.0;
                                      *(undefined8 *)(pSVar15->ptDelays + 5) = 0;
                                      pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                                      pSVar15->pRoot = pMVar4;
                                      pSVar15->uTruth[0] = uTruth[0];
                                      pSVar15->uTruth[1] = uTruth[1];
                                      memcpy(pSVar15->ptDelays,tPinDelaysRes,(long)iVar10 << 2);
                                      pSVar15->Area = local_1b8;
                                      *(uint *)&pSVar15->field_0x8 =
                                           *(uint *)&pSVar15->field_0x8 & 0xffffff03 | 0x14;
                                      pSVar15->pFanins[0] = local_a0;
                                      pSVar15->pFanins[1] = local_b8;
                                      pSVar15->pFanins[2] = pSVar35;
                                      pSVar15->pFanins[3] = local_98;
                                      pSVar15->pFanins[4] = pSVar19;
                                      pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                                      pSVar15->tDelayMax = fVar41;
                                      Super_AddGateToTable(pMan,pSVar15);
                                      if (nGatesMax != 0) {
                                        pSVar30 = local_b0;
                                        pSVar29 = local_180;
                                        plVar18 = local_178;
                                        fVar41 = local_170._0_4_;
                                        if (pMan->nClasses <= nGatesMax) goto LAB_00413908;
                                        goto LAB_00414757;
                                      }
                                    }
                                    pSVar30 = local_b0;
                                    pSVar29 = local_180;
                                    plVar18 = local_178;
                                    fVar41 = local_170._0_4_;
                                  }
LAB_00413908:
                                  pSVar31 = (Super_Gate_t *)((long)&pSVar31->pRoot + 1);
                                } while (pSVar30 != pSVar31);
                              }
                              pSVar24 = (Super_Gate_t *)((long)&pSVar24->pRoot + 1);
                            } while (pSVar24 != pSVar30);
                          }
                          pSVar34 = (Super_Gate_t *)((long)&pSVar34->pRoot + 1);
                        } while (pSVar34 != pSVar30);
                      }
                      pSVar29 = (Super_Gate_t *)((long)&pSVar29->pRoot + 1);
                    } while (pSVar29 != pSVar30);
                    pSVar23 = (Super_Gate_t *)((long)&pSVar23->pRoot + 1);
                  } while (pSVar23 != pSVar30);
                  break;
                case 6:
                  if (iVar9 < 1) goto LAB_00414730;
                  pSVar23 = (Super_Gate_t *)0x0;
                  iVar9 = 0;
                  do {
                    pSVar34 = (Super_Gate_t *)plVar18[(long)pSVar23];
                    if (pSVar34 == (Super_Gate_t *)0x0) break;
                    fVar40 = pSVar34->Area + fVar39;
                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar40)) break;
                    Key._0_4_ = pSVar34->uTruth[0];
                    Key._4_4_ = pSVar34->uTruth[1];
                    ts.tv_sec = (__time_t)pSVar34->ptDelays;
                    pSVar29 = (Super_Gate_t *)0x0;
                    local_170 = (Super_Gate_t *)CONCAT44(local_170._4_4_,fVar40);
                    local_180 = pSVar23;
                    do {
                      local_a0 = (Super_Gate_t *)plVar18[(long)pSVar29];
                      if (local_a0 == (Super_Gate_t *)0x0) break;
                      if (pSVar29 != pSVar23) {
                        fVar41 = local_a0->Area + fVar40;
                        if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar41)) break;
                        local_e0 = local_a0->uTruth[0];
                        local_dc = local_a0->uTruth[1];
                        ts.tv_nsec = (__syscall_slong_t)local_a0->ptDelays;
                        pSVar35 = (Super_Gate_t *)0x0;
                        do {
                          local_98 = (Super_Gate_t *)plVar18[(long)pSVar35];
                          if (local_98 == (Super_Gate_t *)0x0) break;
                          if (pSVar35 != pSVar29 && pSVar35 != pSVar23) {
                            fVar42 = local_98->Area + fVar41;
                            if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar42)) break;
                            local_d8 = local_98->uTruth[0];
                            local_d4 = local_98->uTruth[1];
                            pSVar24 = (Super_Gate_t *)0x0;
                            local_168 = (Super_Gate_t *)CONCAT44(local_168._4_4_,fVar42);
                            do {
                              local_b8 = (Super_Gate_t *)plVar18[(long)pSVar24];
                              if (local_b8 == (Super_Gate_t *)0x0) break;
                              if (((pSVar24 != pSVar35) && (pSVar24 != pSVar23)) &&
                                 (pSVar24 != pSVar29)) {
                                fVar43 = local_b8->Area + fVar42;
                                if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < fVar43)) break;
                                local_d0 = local_b8->uTruth[0];
                                local_cc = local_b8->uTruth[1];
                                pSVar19 = (Super_Gate_t *)0x0;
                                local_7c = fVar43;
                                do {
                                  pSVar31 = (Super_Gate_t *)plVar18[(long)pSVar19];
                                  if (pSVar31 == (Super_Gate_t *)0x0) break;
                                  if (((pSVar19 != pSVar24) && (pSVar19 != pSVar35)) &&
                                     ((pSVar19 != pSVar23 && (pSVar19 != pSVar29)))) {
                                    if (iVar9 != 0) {
                                      iVar9 = 1;
                                      break;
                                    }
                                    iVar9 = Super_CheckTimeout(pPro,pMan);
                                    local_b0 = (Super_Gate_t *)
                                               CONCAT44(local_b0._4_4_,pSVar31->Area + local_7c);
                                    pSVar23 = local_180;
                                    fVar40 = local_170._0_4_;
                                    fVar42 = local_168._0_4_;
                                    if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b8))
                                    break;
                                    local_c8 = pSVar31->uTruth[0];
                                    local_c4 = pSVar31->uTruth[1];
                                    pSVar32 = (Super_Gate_t *)0x0;
                                    do {
                                      pSVar3 = (Super_Gate_t *)plVar18[(long)pSVar32];
                                      if (pSVar3 == (Super_Gate_t *)0x0) break;
                                      if ((((pSVar19 != pSVar32) && (pSVar24 != pSVar32)) &&
                                          (pSVar35 != pSVar32)) &&
                                         ((pSVar23 != pSVar32 && (pSVar29 != pSVar32)))) {
                                        if (iVar9 != 0) goto LAB_00414757;
                                        iVar9 = Super_CheckTimeout(pPro,pMan);
                                        local_1b8 = pSVar3->Area + local_b0._0_4_;
                                        if ((0.0 < pMan->tAreaMax) && (pMan->tAreaMax < local_1b8))
                                        {
                                          pSVar23 = local_180;
                                          fVar40 = local_170._0_4_;
                                          fVar42 = local_168._0_4_;
                                          break;
                                        }
                                        local_c0 = pSVar3->uTruth[0];
                                        local_bc = pSVar3->uTruth[1];
                                        Mio_DeriveGateDelays
                                                  (__ptr[local_138],(float **)&ts,6,pMan->nVarsMax,
                                                   -9999.0,tPinDelaysRes,&tPinDelayMax);
                                        Mio_DeriveTruthTable
                                                  (__ptr[local_138],(uint (*) [2])&Key,6,
                                                   pMan->nVarsMax,uTruth);
                                        iVar10 = Super_CompareGates(pMan,uTruth,local_1b8,
                                                                    tPinDelaysRes,pMan->nVarsMax);
                                        fVar40 = tPinDelayMax;
                                        if (iVar10 != 0) {
                                          pMVar4 = __ptr[local_138];
                                          iVar10 = pMan->nVarsMax;
                                          pSVar15 = (Super_Gate_t_conflict *)
                                                    Extra_MmFixedEntryFetch(pMan->pMem);
                                          pSVar15->pRoot = (Mio_Gate_t *)0x0;
                                          *(undefined8 *)&pSVar15->field_0x8 = 0;
                                          *(undefined8 *)(pSVar15->uTruth + 1) = 0;
                                          pSVar15->pFanins[0] = (Super_Gate_t *)0x0;
                                          pSVar15->pFanins[1] = (Super_Gate_t *)0x0;
                                          pSVar15->pFanins[2] = (Super_Gate_t *)0x0;
                                          pSVar15->pFanins[3] = (Super_Gate_t *)0x0;
                                          pSVar15->pFanins[4] = (Super_Gate_t *)0x0;
                                          pSVar15->pFanins[5] = (Super_Gate_t *)0x0;
                                          pSVar15->Area = 0.0;
                                          pSVar15->ptDelays[0] = 0.0;
                                          pSVar15->ptDelays[1] = 0.0;
                                          pSVar15->ptDelays[2] = 0.0;
                                          pSVar15->ptDelays[3] = 0.0;
                                          pSVar15->ptDelays[4] = 0.0;
                                          *(undefined8 *)(pSVar15->ptDelays + 5) = 0;
                                          pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                                          pSVar15->pRoot = pMVar4;
                                          pSVar15->uTruth[0] = uTruth[0];
                                          pSVar15->uTruth[1] = uTruth[1];
                                          memcpy(pSVar15->ptDelays,tPinDelaysRes,(long)iVar10 << 2);
                                          pSVar15->Area = local_1b8;
                                          *(uint *)&pSVar15->field_0x8 =
                                               *(uint *)&pSVar15->field_0x8 & 0xffffff03 | 0x18;
                                          pSVar15->pFanins[0] = pSVar34;
                                          pSVar15->pFanins[1] = local_a0;
                                          pSVar15->pFanins[2] = local_98;
                                          pSVar15->pFanins[3] = local_b8;
                                          pSVar15->pFanins[4] = pSVar31;
                                          pSVar15->pFanins[5] = pSVar3;
                                          pSVar15->pNext = (Super_Gate_t_conflict *)0x0;
                                          pSVar15->tDelayMax = fVar40;
                                          Super_AddGateToTable(pMan,pSVar15);
                                          if (nGatesMax != 0) {
                                            pSVar23 = local_180;
                                            plVar18 = local_178;
                                            fVar40 = local_170._0_4_;
                                            fVar42 = local_168._0_4_;
                                            if (pMan->nClasses <= nGatesMax) goto LAB_0041469d;
                                            goto LAB_00414757;
                                          }
                                        }
                                        pSVar23 = local_180;
                                        plVar18 = local_178;
                                        fVar40 = local_170._0_4_;
                                        fVar42 = local_168._0_4_;
                                      }
LAB_0041469d:
                                      pSVar32 = (Super_Gate_t *)((long)&pSVar32->pRoot + 1);
                                    } while (pSVar30 != pSVar32);
                                  }
                                  pSVar19 = (Super_Gate_t *)((long)&pSVar19->pRoot + 1);
                                } while (pSVar19 != pSVar30);
                              }
                              pSVar24 = (Super_Gate_t *)((long)&pSVar24->pRoot + 1);
                            } while (pSVar24 != pSVar30);
                          }
                          pSVar35 = (Super_Gate_t *)((long)&pSVar35->pRoot + 1);
                        } while (pSVar35 != pSVar30);
                      }
                      pSVar29 = (Super_Gate_t *)((long)&pSVar29->pRoot + 1);
                    } while (pSVar29 != pSVar30);
                    pSVar23 = (Super_Gate_t *)((long)&pSVar23->pRoot + 1);
                  } while (pSVar23 != pSVar30);
                }
              }
              else {
                iVar9 = 0;
              }
              local_138 = local_138 + 1;
            } while ((local_138 < uVar16) && (iVar9 == 0));
          }
LAB_00414757:
          Extra_ProgressBarStop(pPro);
          if (plVar18 != (long *)0x0) {
            free(plVar18);
          }
          uVar25 = local_a8;
          uVar37 = (uint)uVar36;
          pMan->nLevels = uVar37;
          if (fVerbose != 0) {
            iVar9 = 0x9be446;
            printf("Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. "
                   ,uVar36,(ulong)(uint)pMan->nTried,(ulong)(uint)pMan->nAdded,
                   (ulong)(uint)pMan->nRemoved,(ulong)(uint)(pMan->nAdded - pMan->nRemoved),
                   (ulong)(uint)pMan->nLookups,(ulong)(uint)pMan->nAliases);
            Abc_Print(iVar9,"%s =","Time");
            iVar10 = 3;
            iVar9 = clock_gettime(3,(timespec *)&ts);
            if (iVar9 < 0) {
              lVar26 = -1;
            }
            else {
              lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
            }
            Abc_Print(iVar10,"%9.2f sec\n",SUB84((double)(lVar26 + local_58) / 1000000.0,0));
            fflush(_stdout);
          }
          uVar36 = (ulong)(uVar37 + 1);
        } while (uVar37 != uVar25);
      }
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      pMan->Time = lVar26 + local_88;
      if (fVerbose != 0) {
        puts("Writing the output file...");
        fflush(_stdout);
      }
      if (pMan->nGates < 1) {
        puts("The generated library is empty. No output file written.");
        pVVar22 = (Vec_Str_t *)0x0;
      }
      else {
        if (pMan->pGates != (Super_Gate_t_conflict **)0x0) {
          free(pMan->pGates);
          pMan->pGates = (Super_Gate_t_conflict **)0x0;
        }
        ppSVar14 = (Super_Gate_t_conflict **)malloc((long)pMan->nAdded << 3);
        pMan->pGates = ppSVar14;
        pMan->nGates = 0;
        psVar17 = stmm_init_gen(pMan->tTable);
        iVar9 = stmm_gen(psVar17,(char **)tPinDelaysRes,(char **)&Key);
        if (iVar9 != 0) {
          do {
            for (pSVar15 = (Super_Gate_t_conflict *)CONCAT44(Key._4_4_,(uint)Key);
                pSVar15 != (Super_Gate_t_conflict *)0x0; pSVar15 = pSVar15->pNext) {
              if (pSVar15->pRoot != (Mio_Gate_t *)0x0) {
                uVar36 = (ulong)pMan->nVarsMax;
                if (0 < (long)uVar36) {
                  uVar16 = 0;
                  bVar38 = true;
                  bVar7 = false;
                  do {
                    bVar8 = true;
                    if ((-9998.999 <= pSVar15->ptDelays[uVar16]) && (bVar8 = false, bVar7)) {
                      if (bVar38) goto LAB_00414a10;
                      break;
                    }
                    bVar7 = bVar8;
                    uVar16 = uVar16 + 1;
                    bVar38 = uVar16 < uVar36;
                  } while (uVar16 != uVar36);
                }
                iVar9 = pMan->nGates;
                pMan->nGates = iVar9 + 1;
                pMan->pGates[iVar9] = pSVar15;
              }
LAB_00414a10:
            }
            iVar9 = stmm_gen(psVar17,(char **)tPinDelaysRes,(char **)&Key);
          } while (iVar9 != 0);
        }
        stmm_free_gen(psVar17);
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar26 = 1;
        }
        else {
          lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        ppSVar14 = pMan->pGates;
        qsort(ppSVar14,(long)pMan->nGates,8,Super_WriteCompare);
        pSVar15 = *pMan->pGates;
        pSVar5 = pMan->pGates[(long)pMan->nGates + -1];
        uVar25 = pSVar5->uTruth[1];
        uVar37 = pSVar15->uTruth[1];
        if ((uVar25 <= uVar37) && ((uVar25 < uVar37 || (pSVar5->uTruth[0] < pSVar15->uTruth[0])))) {
          __assert_fail("Super_WriteCompare( pMan->pGates, pMan->pGates + pMan->nGates - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                        ,0x402,"Vec_Str_t *Super_Write(Super_Man_t *)");
        }
        if (pMan->fVerbose != 0) {
          Abc_Print((int)ppSVar14,"%s =","Sorting");
          iVar10 = 3;
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar28 = -1;
          }
          else {
            lVar28 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar10,"%9.2f sec\n",SUB84((double)(lVar28 + lVar26) / 1000000.0,0));
        }
        iVar10 = 3;
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar26 = 1;
        }
        else {
          lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        if (pMan->fWriteOldFormat != 0) {
          pcVar13 = (char *)malloc(10000);
          pcVar20 = Extra_FileNameGeneric(pMan->pName);
          sprintf(pcVar13,"%s.super_old",pcVar20);
          if (pcVar20 != (char *)0x0) {
            free(pcVar20);
          }
          pMan->nUnique = 1;
          iVar9 = pMan->nGates;
          if (0 < (long)iVar9) {
            uVar36 = 0;
            do {
              pSVar15 = pMan->pGates[uVar36];
              if ((pSVar15 == (Super_Gate_t_conflict *)0x0) || (iVar9 - 1 == uVar36)) break;
              pSVar5 = pMan->pGates[uVar36 + 1];
              if ((pSVar5->uTruth[0] != pSVar15->uTruth[0]) ||
                 (pSVar5->uTruth[1] != pSVar15->uTruth[1])) {
                pMan->nUnique = pMan->nUnique + 1;
              }
              uVar36 = uVar36 + 1;
            } while ((long)iVar9 != uVar36);
          }
          __s = fopen(pcVar13,"w");
          fwrite("#\n",2,1,__s);
          pcVar20 = pMan->pName;
          uVar36 = 0;
          pcVar21 = Extra_TimeStamp();
          fprintf(__s,"# Supergate library derived for \"%s\" on %s.\n",pcVar20,pcVar21);
          fwrite("#\n",2,1,__s);
          pcVar20 = "";
          if (pMan->fSkipInv == 0) {
            pcVar20 = "-s";
          }
          fprintf(__s,"# Command line: \"super -I %d -L %d -N %d -T %d -D %.2f -A %.2f %s %s\".\n",
                  SUB84((double)pMan->tDelayMax,0),(double)pMan->tAreaMax,
                  (ulong)(uint)pMan->nVarsMax,(ulong)(uint)pMan->nLevels,
                  (ulong)(uint)pMan->nGatesMax,(ulong)(uint)pMan->TimeLimit,pcVar20,pMan->pName);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# The number of inputs      = %10d.\n",(ulong)(uint)pMan->nVarsMax);
          fprintf(__s,"# The number of levels      = %10d.\n",(ulong)(uint)pMan->nLevels);
          fprintf(__s,"# The maximum delay         = %10.2f.\n",SUB84((double)pMan->tDelayMax,0));
          fprintf(__s,"# The maximum area          = %10.2f.\n",SUB84((double)pMan->tAreaMax,0));
          fprintf(__s,"# The maximum runtime (sec) = %10d.\n",(ulong)(uint)pMan->TimeLimit);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# The number of attempts    = %10d.\n",(ulong)(uint)pMan->nTried);
          fprintf(__s,"# The number of supergates  = %10d.\n",(ulong)(uint)pMan->nGates);
          fprintf(__s,"# The number of functions   = %10d.\n",(ulong)(uint)pMan->nUnique);
          dVar6 = ldexp(1.0,pMan->nMints);
          fprintf(__s,"# The total functions       = %.0f (2^%d).\n",SUB84(dVar6,0),
                  (ulong)(uint)pMan->nMints);
          fwrite("#\n",2,1,__s);
          fprintf(__s,"# Generation time           = %10.2f sec.\n",
                  SUB84((double)((float)pMan->Time / 1e+06),0));
          fwrite("#\n",2,1,__s);
          fprintf(__s,"%s\n",pMan->pName);
          fprintf(__s,"%d\n",(ulong)(uint)pMan->nVarsMax);
          fprintf(__s,"%d\n",(ulong)(uint)pMan->nGates);
          if (0 < pMan->nGates) {
            uVar16 = 0;
            do {
              uVar36 = uVar16;
              pSVar15 = pMan->pGates[uVar36];
              if (pSVar15 == (Super_Gate_t_conflict *)0x0) goto LAB_00414f45;
              uVar16 = uVar36 + 1;
              Super_WriteLibraryGate((FILE *)__s,pMan,pSVar15,(int)uVar16);
              if (uVar36 == pMan->nGates - 1) break;
              if ((pMan->pGates[uVar36 + 1]->uTruth[0] != pSVar15->uTruth[0]) ||
                 (pMan->pGates[uVar36 + 1]->uTruth[1] != pSVar15->uTruth[1])) {
                fputc(10,__s);
              }
            } while ((long)uVar16 < (long)pMan->nGates);
            uVar36 = (ulong)((int)uVar36 + 1);
          }
LAB_00414f45:
          if ((int)uVar36 != pMan->nGates) {
            __assert_fail("Counter == pMan->nGates",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superGate.c"
                          ,0x500,"void Super_WriteLibrary(Super_Man_t *)");
          }
          fclose(__s);
          iVar10 = (int)__s;
          if (pMan->fVerbose != 0) {
            printf("The supergates are written using old format \"%s\" ",pcVar13);
            iVar9 = Extra_FileSize(pcVar13);
            iVar10 = 0x9be1ba;
            printf("(%0.3f MB).\n",SUB84((double)iVar9 * 9.5367431640625e-07,0));
          }
          if (pcVar13 != (char *)0x0) {
            free(pcVar13);
            iVar10 = (int)pcVar13;
          }
        }
        if (pMan->fVerbose != 0) {
          Abc_Print(iVar10,"%s =","Writing old format");
          iVar10 = 3;
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar28 = -1;
          }
          else {
            lVar28 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar10,"%9.2f sec\n",SUB84((double)(lVar28 + lVar26) / 1000000.0,0));
        }
        iVar9 = clock_gettime(3,(timespec *)&ts);
        if (iVar9 < 0) {
          lVar26 = 1;
        }
        else {
          lVar26 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar26 = ((lVar26 >> 7) - (lVar26 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        pSVar33 = pMan;
        pVVar22 = Super_WriteLibraryTreeStr(pMan);
        if (pMan->fVerbose != 0) {
          Abc_Print((int)pSVar33,"%s =","Writing new format");
          iVar10 = 3;
          iVar9 = clock_gettime(3,(timespec *)&ts);
          if (iVar9 < 0) {
            lVar28 = -1;
          }
          else {
            lVar28 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          Abc_Print(iVar10,"%9.2f sec\n",SUB84((double)(lVar28 + lVar26) / 1000000.0,0));
        }
      }
      Super_ManStop(pMan);
      if (__ptr == (Mio_Gate_t **)0x0) {
        return pVVar22;
      }
      free(__ptr);
      return pVVar22;
    }
    fwrite("Error: No genlib gates satisfy the limits criteria. Stop.\n",0x3a,1,_stderr);
    fprintf(_stderr,"Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n",
            SUB84((double)pMan->tDelayMax,0),(double)pMan->tAreaMax,(ulong)(uint)pMan->TimeLimit);
    Super_ManStop(pMan);
    if (__ptr != (Mio_Gate_t **)0x0) {
      free(__ptr);
    }
  }
  return (Vec_Str_t *)0x0;
}

Assistant:

Vec_Str_t * Super_PrecomputeStr( Mio_Library_t * pLibGen, int nVarsMax, int nLevels, int nGatesMax, float tDelayMax, float tAreaMax, int TimeLimit, int fSkipInv, int fVerbose )
{
    Vec_Str_t * vStr;
    Super_Man_t * pMan;
    Mio_Gate_t ** ppGates;
    int nGates, Level;
    abctime clk, clockStart;

    assert( nVarsMax < 7 );
    if ( nGatesMax && nGatesMax < nVarsMax )
    {
        fprintf( stderr, "Erro! The number of supergates requested (%d) in less than the number of variables (%d).\n", nGatesMax, nVarsMax );
        fprintf( stderr, "The library cannot be computed.\n" );
        return NULL;
    }

    // get the root gates
    ppGates = Mio_CollectRoots( pLibGen, nVarsMax, tDelayMax, 0, &nGates, fVerbose );
    if ( nGatesMax && nGates >= nGatesMax )
    {
        fprintf( stdout, "Warning! Genlib library contains more gates than can be computed.\n");
        fprintf( stdout, "Only one-gate supergates are included in the supergate library.\n" );
    }

    // start the manager
    pMan = Super_ManStart();
    pMan->pName     = Mio_LibraryReadName(pLibGen);
    pMan->nGatesMax = nGatesMax;
    pMan->fSkipInv  = fSkipInv;
    pMan->tDelayMax = tDelayMax;
    pMan->tAreaMax  = tAreaMax;
    pMan->TimeLimit = TimeLimit; // in seconds
    pMan->TimeStop  = TimeLimit ? TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0; // in CPU ticks
    pMan->fVerbose  = fVerbose;

    if ( nGates == 0 )
    {
        fprintf( stderr, "Error: No genlib gates satisfy the limits criteria. Stop.\n");
        fprintf( stderr, "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
            pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );

        // stop the manager
        Super_ManStop( pMan );
        ABC_FREE( ppGates );

        return NULL;
    }

    // get the starting supergates
    Super_First( pMan, nVarsMax );

    // perform the computation of supergates
    clockStart = Abc_Clock();
if ( fVerbose )
{
    printf( "Computing supergates with %d inputs, %d levels, and %d max gates.\n", 
        pMan->nVarsMax, nLevels, nGatesMax );
    printf( "Limits: max delay =  %.2f, max area =  %.2f, time limit = %d sec.\n", 
        pMan->tDelayMax, pMan->tAreaMax, pMan->TimeLimit );
}

    for ( Level = 1; Level <= nLevels; Level++ )
    {
        if ( pMan->TimeStop && Abc_Clock() > pMan->TimeStop )
            break;
clk = Abc_Clock();
        Super_Compute( pMan, ppGates, nGates, nGatesMax, fSkipInv );
        pMan->nLevels = Level;
if ( fVerbose )
{
        printf( "Lev %d: Try =%12d. Add =%6d. Rem =%5d. Save =%6d. Lookups =%12d. Aliases =%12d. ",
           Level, pMan->nTried, pMan->nAdded, pMan->nRemoved, pMan->nAdded - pMan->nRemoved, pMan->nLookups, pMan->nAliases );
ABC_PRT( "Time", Abc_Clock() - clk );
fflush( stdout );
}
    }
    pMan->Time = Abc_Clock() - clockStart;

if ( fVerbose )
{
printf( "Writing the output file...\n" );
fflush( stdout );
}
    // write them into a file
    vStr = Super_Write( pMan );

    // stop the manager
    Super_ManStop( pMan );
    ABC_FREE( ppGates );
    return vStr;
}